

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create(NameableEventBase<axl::sl::False> *this)

{
  int in_ESI;
  NameableEventBase<axl::sl::False> *in_RDI;
  
  close(in_RDI,in_ESI);
  in_RDI->m_event = (EventImpl *)&in_RDI->field_3;
  CondMutexEventBase<axl::sl::False>::CondMutexEventBase
            ((CondMutexEventBase<axl::sl::False> *)in_RDI);
  return true;
}

Assistant:

bool
	create() {
		close();

		m_event = (EventImpl*)m_unnamedEventBuffer;
		new(m_event) EventImpl;
		return true;
	}